

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

void af_latin_hints_link_segments
               (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  char cVar1;
  undefined2 uVar2;
  short sVar3;
  uint uVar4;
  AF_Segment pAVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  AF_Segment_conflict pAVar11;
  AF_Segment_conflict pAVar12;
  FT_Pos FVar13;
  short sVar14;
  AF_Segment_conflict pAVar15;
  AF_Segment_conflict pAVar16;
  
  pAVar11 = hints->axis[dim].segments;
  if (width_count == 0) {
    FVar13 = 0;
  }
  else {
    FVar13 = widths[width_count - 1].org;
  }
  pAVar12 = pAVar11 + hints->axis[dim].num_segments;
  uVar4 = *(uint *)&hints->metrics[1].style_class;
  uVar10 = 1;
  if (0xff < (ulong)uVar4) {
    uVar10 = (ulong)(uVar4 >> 8);
  }
  for (pAVar15 = pAVar11; pAVar15 < pAVar12; pAVar15 = pAVar15 + 1) {
    cVar1 = pAVar15->dir;
    pAVar16 = pAVar11;
    if (hints->axis[dim].major_dir == (int)cVar1) {
      for (; pAVar16 < pAVar12; pAVar16 = pAVar16 + 1) {
        if (pAVar15->pos < pAVar16->pos && (int)pAVar16->dir + (int)cVar1 == 0) {
          uVar2 = pAVar15->max_coord;
          sVar14 = pAVar16->min_coord;
          if (pAVar16->min_coord < pAVar15->min_coord) {
            sVar14 = pAVar15->min_coord;
          }
          sVar3 = pAVar16->max_coord;
          if ((short)uVar2 < sVar3) {
            sVar3 = uVar2;
          }
          if ((long)uVar10 <= (long)sVar3 - (long)sVar14) {
            uVar9 = (long)pAVar16->pos - (long)pAVar15->pos;
            if (FVar13 != 0) {
              lVar8 = (long)(uVar9 * 0x400) / FVar13;
              uVar9 = 32000;
              if (lVar8 < 0x2b11) {
                if (lVar8 < 0x401) {
                  uVar9 = 0;
                }
                else {
                  iVar7 = (int)lVar8 + -0x400;
                  uVar9 = (ulong)(uint)(iVar7 * iVar7) / 3000;
                }
              }
            }
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (ulong)uVar4 * 6000 >> 0xb;
            lVar8 = SUB168(auVar6 / SEXT816((long)sVar3 - (long)sVar14),0) + uVar9;
            if (lVar8 < pAVar15->score) {
              pAVar15->score = lVar8;
              pAVar15->link = pAVar16;
            }
            if (lVar8 < pAVar16->score) {
              pAVar16->score = lVar8;
              pAVar16->link = pAVar15;
            }
          }
        }
      }
    }
  }
  for (; pAVar11 < pAVar12; pAVar11 = pAVar11 + 1) {
    pAVar5 = pAVar11->link;
    if ((pAVar5 != (AF_Segment)0x0) && (pAVar11 != pAVar5->link)) {
      pAVar11->link = (AF_Segment)0x0;
      pAVar11->serif = pAVar5->link;
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_hints_link_segments( AF_GlyphHints  hints,
                                FT_UInt        width_count,
                                AF_WidthRec*   widths,
                                AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = segments + axis->num_segments;
    FT_Pos        len_threshold, len_score, dist_score, max_width;
    AF_Segment    seg1, seg2;


    if ( width_count )
      max_width = widths[width_count - 1].org;
    else
      max_width = 0;

    /* a heuristic value to set up a minimum value for overlapping */
    len_threshold = AF_LATIN_CONSTANT( hints->metrics, 8 );
    if ( len_threshold == 0 )
      len_threshold = 1;

    /* a heuristic value to weight lengths */
    len_score = AF_LATIN_CONSTANT( hints->metrics, 6000 );

    /* a heuristic value to weight distances (no call to    */
    /* AF_LATIN_CONSTANT needed, since we work on multiples */
    /* of the stem width)                                   */
    dist_score = 3000;

    /* now compare each segment to the others */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      if ( seg1->dir != axis->major_dir )
        continue;

      /* search for stems having opposite directions, */
      /* with seg1 to the `left' of seg2              */
      for ( seg2 = segments; seg2 < segment_limit; seg2++ )
      {
        FT_Pos  pos1 = seg1->pos;
        FT_Pos  pos2 = seg2->pos;


        if ( seg1->dir + seg2->dir == 0 && pos2 > pos1 )
        {
          /* compute distance between the two segments */
          FT_Pos  min = seg1->min_coord;
          FT_Pos  max = seg1->max_coord;
          FT_Pos  len;


          if ( min < seg2->min_coord )
            min = seg2->min_coord;

          if ( max > seg2->max_coord )
            max = seg2->max_coord;

          /* compute maximum coordinate difference of the two segments */
          /* (this is, how much they overlap)                          */
          len = max - min;
          if ( len >= len_threshold )
          {
            /*
             *  The score is the sum of two demerits indicating the
             *  `badness' of a fit, measured along the segments' main axis
             *  and orthogonal to it, respectively.
             *
             *  o The less overlapping along the main axis, the worse it
             *    is, causing a larger demerit.
             *
             *  o The nearer the orthogonal distance to a stem width, the
             *    better it is, causing a smaller demerit.  For simplicity,
             *    however, we only increase the demerit for values that
             *    exceed the largest stem width.
             */

            FT_Pos  dist = pos2 - pos1;

            FT_Pos  dist_demerit, score;


            if ( max_width )
            {
              /* distance demerits are based on multiples of `max_width'; */
              /* we scale by 1024 for getting more precision              */
              FT_Pos  delta = ( dist << 10 ) / max_width - ( 1 << 10 );


              if ( delta > 10000 )
                dist_demerit = 32000;
              else if ( delta > 0 )
                dist_demerit = delta * delta / dist_score;
              else
                dist_demerit = 0;
            }
            else
              dist_demerit = dist; /* default if no widths available */

            score = dist_demerit + len_score / len;

            /* and we search for the smallest score */
            if ( score < seg1->score )
            {
              seg1->score = score;
              seg1->link  = seg2;
            }

            if ( score < seg2->score )
            {
              seg2->score = score;
              seg2->link  = seg1;
            }
          }
        }
      }
    }

    /* now compute the `serif' segments, cf. explanations in `afhints.h' */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      seg2 = seg1->link;

      if ( seg2 )
      {
        if ( seg2->link != seg1 )
        {
          seg1->link  = 0;
          seg1->serif = seg2->link;
        }
      }
    }
  }